

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtaudio_c.cpp
# Opt level: O2

rtaudio_t rtaudio_create(rtaudio_api_t api)

{
  rtaudio_t __s;
  RtAudio *this;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  __s = (rtaudio_t)operator_new(0x220);
  memset(__s,0,0x220);
  this = (RtAudio *)operator_new(8);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/thestk[P]rtaudio/rtaudio_c.cpp:67:5)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/thestk[P]rtaudio/rtaudio_c.cpp:67:5)>
             ::_M_manager;
  local_38._M_unused._M_object = __s;
  RtAudio::RtAudio(this,api,(RtAudioErrorCallback *)&local_38);
  __s->audio = this;
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return __s;
}

Assistant:

rtaudio_t rtaudio_create(rtaudio_api_t api) {
  rtaudio_t audio = new struct rtaudio();
  audio->errtype = RTAUDIO_ERROR_NONE;
  audio->audio = new RtAudio((RtAudio::Api)api,
    [audio](RtAudioErrorType type, const std::string &errorText){
      audio->errtype = (rtaudio_error_t)type;
      strncpy(audio->errmsg, errorText.c_str(), errorText.size() - 1);
    });
  return audio;
}